

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::detail::binary_assert<0,std::__cxx11::string,char[9]>
               (Enum at,char *file,int line,char *expr,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               char (*rhs) [9])

{
  code *pcVar1;
  char (*op) [9];
  bool bVar2;
  char extraout_AL;
  undefined1 uVar3;
  bool bVar4;
  ContextOptions *pCVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  ResultBuilder rb;
  String local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  char (*local_c8) [9];
  AssertData local_c0;
  
  local_d0 = lhs;
  bVar2 = std::operator==(lhs,*rhs);
  local_c0.m_failed = !bVar2;
  if (is_running_in_test == '\0') {
    if (bVar2) {
      return bVar2;
    }
    String::String(&local_e8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_e8);
    String::~String(&local_e8);
    stringifyBinaryExpr<std::__cxx11::string,char[9]>
              (&local_e8,(detail *)local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1302ef,*rhs,
               (char (*) [9])expr);
    String::operator=(&local_c0.m_decomp,&local_e8);
    String::~String(&local_e8);
    failed_out_of_a_testing_context(&local_c0);
    bVar4 = isDebuggerActive();
    if ((bVar4) && (pCVar5 = getContextOptions(), pCVar5->no_breaks == false)) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return (bool)uVar3;
    }
    bVar4 = checkIfShouldThrow(at);
    if (bVar4) {
      throwException();
    }
  }
  else {
    local_c8 = rhs;
    String::String(&local_e8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_e8);
    String::~String(&local_e8);
    op = local_c8;
    if ((!bVar2) || (pCVar5 = getContextOptions(), __x = extraout_XMM0_Qa, pCVar5->success == true))
    {
      stringifyBinaryExpr<std::__cxx11::string,char[9]>
                (&local_e8,(detail *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1302ef,*op,
                 (char (*) [9])expr);
      String::operator=(&local_c0.m_decomp,&local_e8);
      String::~String(&local_e8);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)&local_c0,__x);
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return (bool)uVar3;
    }
    if ((local_c0.m_failed == true) && (bVar4 = checkIfShouldThrow(at), bVar4)) {
      throwException();
    }
  }
  AssertData::~AssertData(&local_c0);
  return bVar2;
}

Assistant:

DOCTEST_NOINLINE bool binary_assert(assertType::Enum at, const char* file, int line,
                                        const char* expr, const DOCTEST_REF_WRAP(L) lhs,
                                        const DOCTEST_REF_WRAP(R) rhs) {
        bool failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        DOCTEST_ASSERT_IN_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        return !failed;
    }